

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Path.cpp
# Opt level: O3

const_iterator * __thiscall llvm::sys::path::const_iterator::operator++(const_iterator *this)

{
  StringRef *pSVar1;
  char cVar2;
  Style SVar3;
  ulong uVar4;
  size_type sVar5;
  ulong uVar6;
  ulong uVar7;
  char *pcVar8;
  bool bVar9;
  StringRef Chars;
  
  uVar4 = (this->Path).Length;
  if (uVar4 <= this->Position) {
    __assert_fail("Position < Path.size() && \"Tried to increment past end!\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/Path.cpp"
                  ,0x102,"const_iterator &llvm::sys::path::const_iterator::operator++()");
  }
  pSVar1 = &this->Component;
  uVar7 = (this->Component).Length;
  uVar6 = this->Position + uVar7;
  this->Position = uVar6;
  if (uVar6 == uVar4) {
    pSVar1->Data = (char *)0x0;
    (this->Component).Length = 0;
    return this;
  }
  if (uVar7 < 3) {
LAB_001210ff:
    bVar9 = false;
  }
  else {
    pcVar8 = (this->Component).Data;
    cVar2 = *pcVar8;
    if ((((cVar2 != '/') && (cVar2 != '\\' || this->S != windows)) || (pcVar8[1] != cVar2)) ||
       (pcVar8[2] == '/')) goto LAB_001210ff;
    bVar9 = pcVar8[2] != '\\' || this->S != windows;
  }
  if (uVar4 <= uVar6) {
LAB_0012122b:
    __assert_fail("Index < Length && \"Invalid index!\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/ADT/StringRef.h"
                  ,0xef,"char llvm::StringRef::operator[](size_t) const");
  }
  pcVar8 = (this->Path).Data;
  SVar3 = this->S;
  if ((pcVar8[uVar6] == '/') || (pcVar8[uVar6] == '\\' && SVar3 == windows)) {
    if ((bVar9) || ((uVar7 != 0 && SVar3 == windows && (pSVar1->Data[uVar7 - 1] == ':')))) {
      (this->Component).Data = pcVar8 + uVar6;
    }
    else {
      do {
        if (uVar4 <= uVar6) goto LAB_0012122b;
        if ((pcVar8[uVar6] != '/') && (SVar3 != windows || pcVar8[uVar6] != '\\'))
        goto LAB_001211a7;
        uVar6 = uVar6 + 1;
        this->Position = uVar6;
      } while (uVar4 != uVar6);
      if ((uVar7 == 1) && (uVar6 = uVar4, *pSVar1->Data == '/')) goto LAB_001211a7;
      this->Position = uVar4 - 1;
      (this->Component).Data = ".";
    }
    (this->Component).Length = 1;
  }
  else {
LAB_001211a7:
    pcVar8 = "/";
    if (SVar3 == windows) {
      pcVar8 = "\\/";
    }
    Chars.Length = (ulong)(SVar3 == windows) + 1;
    Chars.Data = pcVar8;
    sVar5 = StringRef::find_first_of(&this->Path,Chars,uVar6);
    uVar4 = (this->Path).Length;
    uVar7 = this->Position;
    if (uVar4 < this->Position) {
      uVar7 = uVar4;
    }
    uVar6 = sVar5;
    if (sVar5 < uVar7) {
      uVar6 = uVar7;
    }
    if (uVar4 < sVar5) {
      uVar6 = uVar4;
    }
    (this->Component).Data = (this->Path).Data + uVar7;
    (this->Component).Length = uVar6 - uVar7;
  }
  return this;
}

Assistant:

size_t parent_path_end(StringRef path, Style style) {
    size_t end_pos = filename_pos(path, style);

    bool filename_was_sep =
        path.size() > 0 && is_separator(path[end_pos], style);

    // Skip separators until we reach root dir (or the start of the string).
    size_t root_dir_pos = root_dir_start(path, style);
    while (end_pos > 0 &&
           (root_dir_pos == StringRef::npos || end_pos > root_dir_pos) &&
           is_separator(path[end_pos - 1], style))
      --end_pos;

    if (end_pos == root_dir_pos && !filename_was_sep) {
      // We've reached the root dir and the input path was *not* ending in a
      // sequence of slashes. Include the root dir in the parent path.
      return root_dir_pos + 1;
    }

    // Otherwise, just include before the last slash.
    return end_pos;
  }